

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O2

void TrackMemberNodesInObjectForIntConstants
               (ByteCodeGenerator *byteCodeGenerator,ParseNodePtr objNode)

{
  ParseNode *this;
  code *pcVar1;
  bool bVar2;
  OpCode OVar3;
  undefined4 *puVar4;
  ParseNodeUni *pPVar5;
  ParseNodePtr *ppPVar6;
  ParseNode *this_00;
  ParseNodeBin *pPVar7;
  ParseNodeStr *pPVar8;
  ParseNodePtr pPVar9;
  
  if (objNode->nop != knopObject) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                       ,0x2b0d,"(objNode->nop == knopObject)","objNode->nop == knopObject");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  pPVar5 = ParseNode::AsParseNodeUni(objNode);
  ppPVar6 = &pPVar5->pnode1;
  do {
    pPVar9 = *ppPVar6;
    do {
      this_00 = pPVar9;
      if (this_00 == (ParseNode *)0x0) {
        return;
      }
      OVar3 = this_00->nop;
      pPVar9 = this_00;
      if (OVar3 == knopList) {
        pPVar7 = ParseNode::AsParseNodeBin(this_00);
        pPVar9 = pPVar7->pnode1;
        OVar3 = pPVar9->nop;
      }
      if (OVar3 != knopEllipsis) {
        pPVar7 = ParseNode::AsParseNodeBin(pPVar9);
        this = pPVar7->pnode1;
        pPVar7 = ParseNode::AsParseNodeBin(pPVar9);
        if ((this->nop != knopComputedName) && (pPVar7->pnode2->nop == knopInt)) {
          pPVar8 = ParseNode::AsParseNodeStr(this);
          Js::ScriptContext::TrackIntConstPropertyOnGlobalUserObject
                    (byteCodeGenerator->scriptContext,pPVar8->pid->m_propertyId);
        }
      }
      pPVar9 = (ParseNode *)0x0;
    } while (this_00->nop != knopList);
    pPVar7 = ParseNode::AsParseNodeBin(this_00);
    ppPVar6 = &pPVar7->pnode2;
  } while( true );
}

Assistant:

void TrackMemberNodesInObjectForIntConstants(ByteCodeGenerator *byteCodeGenerator, ParseNodePtr objNode)
{
    Assert(objNode->nop == knopObject);

    ParseNodePtr memberList = objNode->AsParseNodeUni()->pnode1;

    while (memberList != nullptr)
    {
        ParseNodePtr memberNode = memberList->nop == knopList ? memberList->AsParseNodeBin()->pnode1 : memberList;
        if (memberNode->nop != knopEllipsis)
        {
            ParseNodePtr memberNameNode = memberNode->AsParseNodeBin()->pnode1;
            ParseNodePtr memberValNode = memberNode->AsParseNodeBin()->pnode2;

            if (memberNameNode->nop != knopComputedName && memberValNode->nop == knopInt)
            {
                Js::PropertyId propertyId = memberNameNode->AsParseNodeStr()->pid->GetPropertyId();
                TrackIntConstantsOnGlobalUserObject(byteCodeGenerator, true, propertyId);
            }
        }

        memberList = memberList->nop == knopList ? memberList->AsParseNodeBin()->pnode2 : nullptr;
    }
}